

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

void __thiscall
cmFindPathCommand::cmFindPathCommand
          (cmFindPathCommand *this,string *findCommandName,cmExecutionStatus *status)

{
  string sStack_38;
  
  std::__cxx11::string::string((string *)&sStack_38,(string *)findCommandName);
  cmFindBase::cmFindBase(&this->super_cmFindBase,&sStack_38,status);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_00779ed8;
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).EnvironmentPath);
  this->IncludeFileInPath = false;
  std::__cxx11::string::assign((char *)&(this->super_cmFindBase).VariableDocumentation);
  (this->super_cmFindBase).VariableType = PATH;
  return;
}

Assistant:

cmFindPathCommand::cmFindPathCommand(std::string findCommandName,
                                     cmExecutionStatus& status)
  : cmFindBase(std::move(findCommandName), status)
{
  this->EnvironmentPath = "INCLUDE";
  this->IncludeFileInPath = false;
  this->VariableDocumentation = "Path to a file.";
  this->VariableType = cmStateEnums::PATH;
}